

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyFileCreatorFactory.cpp
# Opt level: O0

void ApprovalTests::EmptyFileCreatorFactory::defaultCreator(string *fullFilePath)

{
  size_t in_RCX;
  void *__buf;
  StringWriter *in_RDI;
  StringWriter s;
  string *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  StringWriter *in_stack_ffffffffffffff40;
  allocator local_a9;
  string local_a8 [55];
  allocator local_71;
  string local_70 [32];
  StringWriter local_50;
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_70,"",&local_71);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_a8,"",&local_a9);
  StringWriter::StringWriter
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  ::std::__cxx11::string::~string(local_a8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  ::std::__cxx11::string::~string(local_70);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_71);
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffff30,(string *)in_RDI);
  StringWriter::write(&local_50,(int)&stack0xffffffffffffff30,__buf,in_RCX);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
  StringWriter::~StringWriter(in_RDI);
  return;
}

Assistant:

void EmptyFileCreatorFactory::defaultCreator(std::string fullFilePath)
    {
        StringWriter s("", "");
        s.write(fullFilePath);
    }